

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O0

UniquePtr<SSL_CTX> __thiscall TestConfig::SetupCtx(TestConfig *this,SSL_CTX *old_ctx)

{
  bool bVar1;
  int iVar2;
  pointer psVar3;
  CRYPTO_BUFFER_POOL *pool;
  ulong uVar4;
  char *str;
  uchar *puVar5;
  size_type sVar6;
  pointer psVar7;
  unsigned_short *prefs;
  _func_int_SSL_ptr_CBB_ptr_uint8_t_ptr_size_t *p_Var8;
  _func_int_SSL_ptr_CRYPTO_BUFFER_ptr_ptr_size_t_uint8_t_ptr_size_t *p_Var9;
  __uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true> in_RDX;
  byte local_199;
  SSL_METHOD *local_d0;
  __5 local_ae;
  __4 local_ad;
  __3 local_ac;
  __2 local_ab;
  __1 local_aa;
  __0 local_a9;
  undefined1 local_a8 [8];
  uint8_t keys [48];
  UniquePtr<struct_stack_st_X509_NAME> names_1;
  UniquePtr<struct_stack_st_X509_NAME> names;
  string local_60 [8];
  string cipher_list;
  unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> local_28;
  UniquePtr<SSL_CTX> ssl_ctx;
  SSL_CTX *old_ctx_local;
  TestConfig *this_local;
  
  ssl_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)
       in_RDX.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
  if (((ulong)old_ctx->x509_method & 0x100) == 0) {
    local_d0 = (SSL_METHOD *)TLS_method();
  }
  else {
    local_d0 = (SSL_METHOD *)DTLS_method();
  }
  psVar3 = (pointer)SSL_CTX_new(local_d0);
  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&local_28,psVar3);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_28);
  if (!bVar1) {
    std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
    goto LAB_00132757;
  }
  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
  pool = BufferPool();
  SSL_CTX_set0_buffer_pool(psVar3,pool);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_60,"ALL:TLS_ECDHE_RSA_WITH_AES_128_CBC_SHA256",
             (allocator<char> *)
             ((long)&names._M_t.super___uniq_ptr_impl<stack_st_X509_NAME,_bssl::internal::Deleter>.
                     _M_t.super__Tuple_impl<0UL,_stack_st_X509_NAME_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_stack_st_X509_NAME_*,_false>._M_head_impl + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&names._M_t.super___uniq_ptr_impl<stack_st_X509_NAME,_bssl::internal::Deleter>.
                     _M_t.super__Tuple_impl<0UL,_stack_st_X509_NAME_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_stack_st_X509_NAME_*,_false>._M_head_impl + 7));
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::operator=(local_60,(string *)&old_ctx[1].cert_compression_algs.size_);
    psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
    SSL_CTX_set_options(psVar3,0x400000);
  }
  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
  str = (char *)std::__cxx11::string::c_str();
  iVar2 = SSL_CTX_set_strict_cipher_list(psVar3,str);
  if (iVar2 == 0) {
    std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
  }
  else {
    if ((((ulong)old_ctx->legacy_ocsp_callback_arg & 0x100) == 0) ||
       (((ulong)old_ctx->x509_method & 1) == 0)) {
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
      SSL_CTX_set_session_cache_mode(psVar3,3);
    }
    else {
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
      SSL_CTX_set_session_cache_mode(psVar3,0x303);
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
      SSL_CTX_sess_set_get_cb((SSL_CTX *)psVar3,GetSessionCallback);
    }
    psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
    SSL_CTX_set_select_certificate_cb(psVar3,SelectCertificateCallback);
    if ((old_ctx[2].lock.__data.__pad1[5] & 1) != 0) {
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
      SSL_CTX_set_client_cert_cb((SSL_CTX *)psVar3,ClientCertCallback);
    }
    psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
    SSL_CTX_set_next_protos_advertised_cb
              ((SSL_CTX *)psVar3,NextProtosAdvertisedCallback,(void *)0x0);
    uVar4 = std::__cxx11::string::empty();
    if (((uVar4 & 1) == 0) || (((ulong)old_ctx->legacy_ocsp_callback_arg & 1) != 0)) {
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
      SSL_CTX_set_next_proto_select_cb((SSL_CTX *)psVar3,NextProtoSelectCallback,(void *)0x0);
    }
    uVar4 = std::__cxx11::string::empty();
    if (((((uVar4 & 1) == 0) || (((ulong)old_ctx[1].default_passwd_callback & 1) != 0)) ||
        (((ulong)old_ctx[1].default_passwd_callback & 0x100) != 0)) ||
       (((ulong)old_ctx[1].default_passwd_callback & 0x10000) != 0)) {
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
      SSL_CTX_set_alpn_select_cb(psVar3,AlpnSelectCallback,(void *)0x0);
    }
    psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
    SSL_CTX_set_current_time_cb(psVar3,CurrentTimeCallback);
    psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
    SSL_CTX_set_info_callback((SSL_CTX *)psVar3,InfoCallback);
    psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
    SSL_CTX_sess_set_new_cb((SSL_CTX *)psVar3,NewSessionCallback);
    if ((old_ctx[1].verify_sigalgs.size_ & 0x10000) == 0) {
      if (((old_ctx[1].verify_sigalgs.size_ & 0x100) != 0) ||
         ((undefined1  [16])
          ((undefined1  [16])
           old_ctx[2].requested_trust_anchors.
           super__Optional_base<bssl::Array<unsigned_char>,_false,_false>._M_payload.
           super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
           super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_payload &
          (undefined1  [16])0x10000) != (undefined1  [16])0x0)) {
        psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
        SSL_CTX_set_tlsext_ticket_key_cb(psVar3,TicketKeyCallback);
      }
    }
    else {
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
      SSL_CTX_set_ticket_aead_method(psVar3,&g_async_ticket_aead_method);
    }
    if (((ulong)old_ctx[2].ex_data.sk & 0x100000000000000) == 0) {
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
      SSL_CTX_set_cert_verify_callback((SSL_CTX *)psVar3,CertVerifyCallback,(void *)0x0);
    }
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &old_ctx[2].lock.__data);
    if (!bVar1) {
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
      puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &old_ctx[2].lock.__data);
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &old_ctx[2].lock.__data);
      iVar2 = SSL_CTX_set_signed_cert_timestamp_list(psVar3,puVar5,sVar6);
      if (iVar2 == 0) {
        std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
        goto LAB_00132741;
      }
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&old_ctx[2].lock + 0x30),"<NULL>");
      if (bVar1) {
        psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
        SSL_CTX_set_client_CA_list((SSL_CTX *)psVar3,(stack_st_X509_NAME *)0x0);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&old_ctx[2].lock + 0x30),"<EMPTY>");
        if (bVar1) {
          std::unique_ptr<stack_st_X509_NAME,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<stack_st_X509_NAME,bssl::internal::Deleter> *)&names_1);
          psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
          psVar7 = std::unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter>::release
                             ((unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter> *)&names_1);
          SSL_CTX_set_client_CA_list((SSL_CTX *)psVar3,(stack_st_X509_NAME *)psVar7);
          std::unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter>::~unique_ptr(&names_1);
        }
        else {
          DecodeHexX509Names((string *)(keys + 0x28));
          psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
          psVar7 = std::unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter>::release
                             ((unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter> *)
                              (keys + 0x28));
          SSL_CTX_set_client_CA_list((SSL_CTX *)psVar3,(stack_st_X509_NAME *)psVar7);
          std::unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter> *)(keys + 0x28));
        }
      }
    }
    if (((ulong)old_ctx[2].session_cache_tail & 0x10000) != 0) {
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
      SSL_CTX_set_grease_enabled(psVar3,1);
    }
    if (((ulong)old_ctx[2].session_cache_tail & 0x1000000) != 0) {
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
      SSL_CTX_set_permute_extensions(psVar3,1);
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
      SSL_CTX_set_tlsext_servername_callback(psVar3,ServerNameCallback);
    }
    if ((old_ctx[1].verify_sigalgs.size_ & 0x10000000000) != 0) {
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
      SSL_CTX_set_early_data_enabled(psVar3,1);
    }
    if (((ulong)old_ctx[2].ex_data.sk & 0x1000000000000) != 0) {
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
      SSL_CTX_set_allow_unknown_alpn_protos(psVar3,1);
    }
    bVar1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::empty
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                       &old_ctx->quic_method);
    if (!bVar1) {
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
      prefs = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                         &old_ctx->quic_method);
      sVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                         &old_ctx->quic_method);
      iVar2 = SSL_CTX_set_verify_algorithm_prefs(psVar3,prefs,sVar6);
      if (iVar2 == 0) {
        std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
        goto LAB_00132741;
      }
    }
    psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
    SSL_CTX_set_msg_callback((SSL_CTX *)psVar3,MessageCallback);
    if ((undefined1  [16])
        ((undefined1  [16])
         old_ctx[2].requested_trust_anchors.
         super__Optional_base<bssl::Array<unsigned_char>,_false,_false>._M_payload.
         super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
         super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_payload &
        (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
      SSL_CTX_set_false_start_allowed_without_alpn(psVar3,1);
    }
    if ((undefined1  [16])
        ((undefined1  [16])
         old_ctx[2].requested_trust_anchors.
         super__Optional_base<bssl::Array<unsigned_char>,_false,_false>._M_payload.
         super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
         super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_payload &
        (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
      SSL_CTX_set_tlsext_status_cb(psVar3,LegacyOCSPCallback);
    }
    if (((ulong)old_ctx[2].cert_compression_algs.data_ & 0x100000000) != 0) {
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
      SSL_CTX_set_resumption_across_names_enabled(psVar3,1);
    }
    if ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)
        ssl_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
      bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &old_ctx[2].handshakes_since_cache_flush);
      if (!bVar1) {
        psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
        puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &old_ctx[2].handshakes_since_cache_flush);
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &old_ctx[2].handshakes_since_cache_flush);
        iVar2 = SSL_CTX_set_tlsext_ticket_keys(psVar3,puVar5,sVar6);
        if (iVar2 == 0) {
          std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
          goto LAB_00132741;
        }
      }
LAB_00132568:
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
      p_Var8 = SetupCtx(ssl_ctx_st*)_const::$_0::operator_cast_to_function_pointer(&local_a9);
      p_Var9 = SetupCtx(ssl_ctx_st*)_const::$_1::operator_cast_to_function_pointer(&local_aa);
      bVar1 = MaybeInstallCertCompressionAlg((TestConfig *)old_ctx,psVar3,0xff02,p_Var8,p_Var9);
      local_199 = 1;
      if (bVar1) {
        psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
        p_Var8 = SetupCtx(ssl_ctx_st*)_const::$_2::operator_cast_to_function_pointer(&local_ab);
        p_Var9 = SetupCtx(ssl_ctx_st*)_const::$_3::operator_cast_to_function_pointer(&local_ac);
        bVar1 = MaybeInstallCertCompressionAlg((TestConfig *)old_ctx,psVar3,0xff01,p_Var8,p_Var9);
        local_199 = 1;
        if (bVar1) {
          psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
          p_Var8 = SetupCtx(ssl_ctx_st*)_const::$_4::operator_cast_to_function_pointer(&local_ad);
          p_Var9 = SetupCtx(ssl_ctx_st*)_const::$_5::operator_cast_to_function_pointer(&local_ae);
          bVar1 = MaybeInstallCertCompressionAlg((TestConfig *)old_ctx,psVar3,0xff03,p_Var8,p_Var9);
          local_199 = bVar1 ^ 0xff;
        }
      }
      if ((local_199 & 1) != 0) {
        fprintf(_stderr,"SSL_CTX_add_cert_compression_alg failed.\n");
        abort();
      }
      if (((ulong)old_ctx[2].msg_callback_arg & 0x100) != 0) {
        psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
        SSL_CTX_set_options(psVar3,0x400000);
      }
      if (((ulong)old_ctx->x509_method & 0x10000) != 0) {
        psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
        SSL_CTX_set_quic_method(psVar3,&g_quic_method);
      }
      std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::unique_ptr
                ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)this,&local_28);
    }
    else {
      iVar2 = SSL_CTX_get_tlsext_ticket_keys
                        ((SSL_CTX *)
                         ssl_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,local_a8,0x30);
      if (iVar2 != 0) {
        psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
        iVar2 = SSL_CTX_set_tlsext_ticket_keys(psVar3,local_a8,0x30);
        if (iVar2 != 0) {
          psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
          CopySessions(psVar3,(SSL_CTX *)
                              ssl_ctx._M_t.
                              super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
          goto LAB_00132568;
        }
      }
      std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
    }
  }
LAB_00132741:
  std::__cxx11::string::~string(local_60);
LAB_00132757:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
  return (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

bssl::UniquePtr<SSL_CTX> TestConfig::SetupCtx(SSL_CTX *old_ctx) const {
  bssl::UniquePtr<SSL_CTX> ssl_ctx(
      SSL_CTX_new(is_dtls ? DTLS_method() : TLS_method()));
  if (!ssl_ctx) {
    return nullptr;
  }

  SSL_CTX_set0_buffer_pool(ssl_ctx.get(), BufferPool());

  std::string cipher_list = "ALL:TLS_ECDHE_RSA_WITH_AES_128_CBC_SHA256";
  if (!cipher.empty()) {
    cipher_list = cipher;
    SSL_CTX_set_options(ssl_ctx.get(), SSL_OP_CIPHER_SERVER_PREFERENCE);
  }
  if (!SSL_CTX_set_strict_cipher_list(ssl_ctx.get(), cipher_list.c_str())) {
    return nullptr;
  }

  if (async && is_server) {
    // Disable the internal session cache. To test asynchronous session lookup,
    // we use an external session cache.
    SSL_CTX_set_session_cache_mode(
        ssl_ctx.get(), SSL_SESS_CACHE_BOTH | SSL_SESS_CACHE_NO_INTERNAL);
    SSL_CTX_sess_set_get_cb(ssl_ctx.get(), GetSessionCallback);
  } else {
    SSL_CTX_set_session_cache_mode(ssl_ctx.get(), SSL_SESS_CACHE_BOTH);
  }

  SSL_CTX_set_select_certificate_cb(ssl_ctx.get(), SelectCertificateCallback);

  if (use_old_client_cert_callback) {
    SSL_CTX_set_client_cert_cb(ssl_ctx.get(), ClientCertCallback);
  }

  SSL_CTX_set_next_protos_advertised_cb(ssl_ctx.get(),
                                        NextProtosAdvertisedCallback, NULL);
  if (!select_next_proto.empty() || select_empty_next_proto) {
    SSL_CTX_set_next_proto_select_cb(ssl_ctx.get(), NextProtoSelectCallback,
                                     NULL);
  }

  if (!select_alpn.empty() || decline_alpn || reject_alpn ||
      select_empty_alpn) {
    SSL_CTX_set_alpn_select_cb(ssl_ctx.get(), AlpnSelectCallback, NULL);
  }

  SSL_CTX_set_current_time_cb(ssl_ctx.get(), CurrentTimeCallback);

  SSL_CTX_set_info_callback(ssl_ctx.get(), InfoCallback);
  SSL_CTX_sess_set_new_cb(ssl_ctx.get(), NewSessionCallback);

  if (use_ticket_aead_callback) {
    SSL_CTX_set_ticket_aead_method(ssl_ctx.get(), &g_async_ticket_aead_method);
  } else if (use_ticket_callback || handshake_hints) {
    // If using handshake hints, always enable some ticket callback, so we can
    // check that hints only mismatch when allowed. The ticket callback also
    // uses a constant key, which simplifies the test.
    SSL_CTX_set_tlsext_ticket_key_cb(ssl_ctx.get(), TicketKeyCallback);
  }

  if (!use_custom_verify_callback) {
    SSL_CTX_set_cert_verify_callback(ssl_ctx.get(), CertVerifyCallback, NULL);
  }

  if (!signed_cert_timestamps.empty() &&
      !SSL_CTX_set_signed_cert_timestamp_list(
          ssl_ctx.get(), (const uint8_t *)signed_cert_timestamps.data(),
          signed_cert_timestamps.size())) {
    return nullptr;
  }

  if (!use_client_ca_list.empty()) {
    if (use_client_ca_list == "<NULL>") {
      SSL_CTX_set_client_CA_list(ssl_ctx.get(), nullptr);
    } else if (use_client_ca_list == "<EMPTY>") {
      bssl::UniquePtr<STACK_OF(X509_NAME)> names;
      SSL_CTX_set_client_CA_list(ssl_ctx.get(), names.release());
    } else {
      bssl::UniquePtr<STACK_OF(X509_NAME)> names =
          DecodeHexX509Names(use_client_ca_list);
      SSL_CTX_set_client_CA_list(ssl_ctx.get(), names.release());
    }
  }

  if (enable_grease) {
    SSL_CTX_set_grease_enabled(ssl_ctx.get(), 1);
  }

  if (permute_extensions) {
    SSL_CTX_set_permute_extensions(ssl_ctx.get(), 1);
  }

  if (!expect_server_name.empty()) {
    SSL_CTX_set_tlsext_servername_callback(ssl_ctx.get(), ServerNameCallback);
  }

  if (enable_early_data) {
    SSL_CTX_set_early_data_enabled(ssl_ctx.get(), 1);
  }

  if (allow_unknown_alpn_protos) {
    SSL_CTX_set_allow_unknown_alpn_protos(ssl_ctx.get(), 1);
  }

  if (!verify_prefs.empty()) {
    if (!SSL_CTX_set_verify_algorithm_prefs(ssl_ctx.get(), verify_prefs.data(),
                                            verify_prefs.size())) {
      return nullptr;
    }
  }

  SSL_CTX_set_msg_callback(ssl_ctx.get(), MessageCallback);

  if (allow_false_start_without_alpn) {
    SSL_CTX_set_false_start_allowed_without_alpn(ssl_ctx.get(), 1);
  }

  if (use_ocsp_callback) {
    SSL_CTX_set_tlsext_status_cb(ssl_ctx.get(), LegacyOCSPCallback);
  }

  if (resumption_across_names_enabled) {
    SSL_CTX_set_resumption_across_names_enabled(ssl_ctx.get(), 1);
  }

  if (old_ctx) {
    uint8_t keys[48];
    if (!SSL_CTX_get_tlsext_ticket_keys(old_ctx, &keys, sizeof(keys)) ||
        !SSL_CTX_set_tlsext_ticket_keys(ssl_ctx.get(), keys, sizeof(keys))) {
      return nullptr;
    }
    CopySessions(ssl_ctx.get(), old_ctx);
  } else if (!ticket_key.empty() &&
             !SSL_CTX_set_tlsext_ticket_keys(ssl_ctx.get(), ticket_key.data(),
                                             ticket_key.size())) {
    return nullptr;
  }

  // These mock compression algorithms match the corresponding ones in
  // |addCertCompressionTests|.
  if (!MaybeInstallCertCompressionAlg(
          this, ssl_ctx.get(), 0xff02,
          [](SSL *ssl, CBB *out, const uint8_t *in, size_t in_len) -> int {
            if (!CBB_add_u8(out, 1) || !CBB_add_u8(out, 2) ||
                !CBB_add_u8(out, 3) || !CBB_add_u8(out, 4) ||
                !CBB_add_bytes(out, in, in_len)) {
              return 0;
            }
            return 1;
          },
          [](SSL *ssl, CRYPTO_BUFFER **out, size_t uncompressed_len,
             const uint8_t *in, size_t in_len) -> int {
            if (in_len < 4 || in[0] != 1 || in[1] != 2 || in[2] != 3 ||
                in[3] != 4 || uncompressed_len != in_len - 4) {
              return 0;
            }
            const bssl::Span<const uint8_t> uncompressed(in + 4, in_len - 4);
            *out = CRYPTO_BUFFER_new(uncompressed.data(), uncompressed.size(),
                                     nullptr);
            return *out != nullptr;
          }) ||
      !MaybeInstallCertCompressionAlg(
          this, ssl_ctx.get(), 0xff01,
          [](SSL *ssl, CBB *out, const uint8_t *in, size_t in_len) -> int {
            if (in_len < 2 || in[0] != 0 || in[1] != 0) {
              return 0;
            }
            return CBB_add_bytes(out, in + 2, in_len - 2);
          },
          [](SSL *ssl, CRYPTO_BUFFER **out, size_t uncompressed_len,
             const uint8_t *in, size_t in_len) -> int {
            if (uncompressed_len != 2 + in_len) {
              return 0;
            }
            auto buf = std::make_unique<uint8_t[]>(2 + in_len);
            buf[0] = 0;
            buf[1] = 0;
            OPENSSL_memcpy(&buf[2], in, in_len);
            *out = CRYPTO_BUFFER_new(buf.get(), 2 + in_len, nullptr);
            return *out != nullptr;
          }) ||
      !MaybeInstallCertCompressionAlg(
          this, ssl_ctx.get(), 0xff03,
          [](SSL *ssl, CBB *out, const uint8_t *in, size_t in_len) -> int {
            uint8_t byte;
            return RAND_bytes(&byte, 1) &&   //
                   CBB_add_u8(out, byte) &&  //
                   CBB_add_bytes(out, in, in_len);
          },
          [](SSL *ssl, CRYPTO_BUFFER **out, size_t uncompressed_len,
             const uint8_t *in, size_t in_len) -> int {
            if (uncompressed_len + 1 != in_len) {
              return 0;
            }
            *out = CRYPTO_BUFFER_new(in + 1, in_len - 1, nullptr);
            return *out != nullptr;
          })) {
    fprintf(stderr, "SSL_CTX_add_cert_compression_alg failed.\n");
    abort();
  }

  if (server_preference) {
    SSL_CTX_set_options(ssl_ctx.get(), SSL_OP_CIPHER_SERVER_PREFERENCE);
  }

  if (is_quic) {
    SSL_CTX_set_quic_method(ssl_ctx.get(), &g_quic_method);
  }

  return ssl_ctx;
}